

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::dumpMemoryToFile(CLIntercept *this,string *fileName,bool hash,void *ptr,size_t size)

{
  long lVar1;
  ostream *poVar2;
  CLIntercept *this_00;
  float __x;
  ofstream os;
  undefined1 local_230 [24];
  uint auStack_218 [56];
  ios_base local_138 [264];
  
  this_00 = (CLIntercept *)local_230;
  std::ofstream::ofstream(this_00);
  __x = (float)std::ofstream::open((char *)this_00,(_Ios_Openmode)(fileName->_M_dataplus)._M_p);
  lVar1 = *(long *)(local_230._0_8_ - 0x18);
  if (*(int *)((long)auStack_218 + lVar1 + 8) == 0) {
    if (hash) {
      computeHash(this_00,ptr,size);
      *(uint *)((long)auStack_218 + lVar1) = *(uint *)((long)auStack_218 + lVar1) & 0xffffffb5 | 8;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    }
    else {
      std::ostream::write(local_230,(long)ptr);
    }
    std::ofstream::close();
  }
  else {
    logf(this,__x);
  }
  local_230._0_8_ = _VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT - 0x18)) = _dlclose;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void CLIntercept::dumpMemoryToFile(
    const std::string& fileName,
    bool hash,
    const void* ptr,
    size_t size  )
{
    std::ofstream os;
    os.open(
        fileName.c_str(),
        std::ios::out | std::ios::binary );

    if( os.good() )
    {
        if( hash )
        {
            uint64_t hashValue = computeHash(ptr, size);
            os << std::hex << hashValue << "\n";
        }
        else
        {
            os.write( (const char*)ptr, size );
        }

        os.close();
    }
    else
    {
        logf( "Failed to open dump file for writing: %s\n",
            fileName.c_str() );
    }
}